

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser.cxx
# Opt level: O3

void __thiscall Fl_File_Chooser::ok_label(Fl_File_Chooser *this,char *l)

{
  int h;
  int w;
  int local_18 [2];
  
  if (l != (char *)0x0) {
    Fl_Widget::label((Fl_Widget *)this->okButton,l);
  }
  local_18[0] = 0;
  local_18[1] = 0;
  Fl_Label::measure(&(this->okButton->super_Fl_Button).super_Fl_Widget.label_,local_18 + 1,local_18)
  ;
  (*(this->okButton->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[4])
            (this->okButton,(ulong)(((this->cancelButton->super_Fl_Widget).x_ - local_18[1]) - 0x32)
             ,(ulong)(uint)(this->cancelButton->super_Fl_Widget).y_,(ulong)(local_18[1] + 0x28),0x19
            );
  Fl_Group::init_sizes((this->okButton->super_Fl_Button).super_Fl_Widget.parent_);
  return;
}

Assistant:

void Fl_File_Chooser::ok_label(const char *l) {
  if (l) okButton->label(l);
  int w=0, h=0;
  okButton->measure_label(w, h);
  okButton->resize(cancelButton->x() - 50 - w, cancelButton->y(),
                   w + 40, 25);
  okButton->parent()->init_sizes();
}